

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::SlackColSubstitution::undo
          (SlackColSubstitution *this,HighsOptions *options,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *rowValues,HighsSolution *solution,HighsBasis *basis)

{
  double *pdVar1;
  HighsBasisStatus HVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer pNVar6;
  pointer pHVar7;
  bool bVar8;
  pointer pNVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  HighsCDouble local_40;
  
  uVar11 = (ulong)this->row;
  pdVar5 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
  pNVar9 = (rowValues->
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar6 = (rowValues->
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar9 == pNVar6) {
    dVar12 = 0.0;
    local_40.lo = 0.0;
    dVar13 = 0.0;
  }
  else {
    local_40.lo = 0.0;
    dVar12 = 0.0;
    dVar14 = 0.0;
    do {
      dVar13 = pNVar9->value;
      if (pNVar9->index != this->col) {
        dVar13 = dVar13 * (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[pNVar9->index];
        dVar15 = dVar12 + dVar13;
        local_40.lo = local_40.lo +
                      (dVar12 - (dVar15 - dVar13)) + (dVar13 - (dVar15 - (dVar15 - dVar13)));
        dVar13 = dVar14;
        dVar12 = dVar15;
      }
      pNVar9 = pNVar9 + 1;
      dVar14 = dVar13;
    } while (pNVar9 != pNVar6);
  }
  if (uVar11 < uVar10) {
    dVar14 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->col] * dVar13;
    dVar15 = dVar12 + dVar14;
    pdVar5[uVar11] =
         (dVar14 - (dVar15 - dVar12)) + (dVar12 - (dVar15 - (dVar15 - dVar12))) + local_40.lo +
         dVar15;
  }
  local_40.hi = this->rhs - dVar12;
  local_40.lo = ((this->rhs - (dVar12 + local_40.hi)) +
                (-dVar12 - (local_40.hi - (dVar12 + local_40.hi)))) - local_40.lo;
  HighsCDouble::operator/=(&local_40,dVar13);
  iVar3 = this->col;
  (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar3] = local_40.hi + local_40.lo;
  if (solution->dual_valid == true) {
    if (uVar11 < uVar10) {
      iVar4 = this->row;
      pdVar5 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar3] = -pdVar5[iVar4] / dVar13;
      if (basis->valid != false) {
        pHVar7 = (basis->row_status).
                 super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                 super__Vector_impl_data._M_start;
        HVar2 = pHVar7[iVar4];
        if (HVar2 == kLower) {
          bVar8 = 0.0 < dVar13;
        }
        else {
          if (HVar2 == kBasic) {
            (basis->col_status).
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3] = kBasic;
            pdVar1 = pdVar5 + iVar4;
            pHVar7[iVar4] = (*pdVar1 <= 0.0 && *pdVar1 != 0.0) * '\x02';
            return;
          }
          bVar8 = dVar13 <= 0.0;
        }
        (basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[iVar3] = bVar8 * '\x02';
      }
    }
    else if (basis->valid != false) {
      (basis->col_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar3] = kNonbasic;
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::SlackColSubstitution::undo(
    const HighsOptions& options, const std::vector<Nonzero>& rowValues,
    HighsSolution& solution, HighsBasis& basis) {
  bool debug_print = false;
  // May have to determine row dual and basis status unless doing
  // primal-only transformation in MIP solver, in which case row may
  // no longer exist if it corresponds to a removed cut, so have to
  // avoid exceeding array bounds of solution.row_value
  bool isModelRow = static_cast<size_t>(row) < solution.row_value.size();

  // compute primal values
  double colCoef = 0;
  HighsCDouble rowValue = 0;
  for (const auto& rowVal : rowValues) {
    if (rowVal.index == col)
      colCoef = rowVal.value;
    else
      rowValue += rowVal.value * solution.col_value[rowVal.index];
  }

  assert(colCoef != 0);
  // Row values aren't fully postsolved, so why do this?
  if (isModelRow)
    solution.row_value[row] =
        double(rowValue + colCoef * solution.col_value[col]);

  solution.col_value[col] = double((rhs - rowValue) / colCoef);

  // If no dual values requested, return here
  if (!solution.dual_valid) return;

  // Row retains its dual value, and column has this dual value scaled by coeff
  if (isModelRow) solution.col_dual[col] = -solution.row_dual[row] / colCoef;

  // Set basis status if necessary
  if (!basis.valid) return;

  // If row is basic, then slack is basic, otherwise row retains its status
  if (isModelRow) {
    HighsBasisStatus save_row_basis_status = basis.row_status[row];
    if (basis.row_status[row] == HighsBasisStatus::kBasic) {
      basis.col_status[col] = HighsBasisStatus::kBasic;
      basis.row_status[row] =
          computeRowStatus(solution.row_dual[row], RowType::kEq);
    } else if (basis.row_status[row] == HighsBasisStatus::kLower) {
      basis.col_status[col] =
          colCoef > 0 ? HighsBasisStatus::kUpper : HighsBasisStatus::kLower;
    } else {
      basis.col_status[col] =
          colCoef > 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
    }
    if (debug_print)
      printf(
          "HighsPostsolveStack::SlackColSubstitution::undo OgRowStatus = %s; "
          "RowStatus = %s; ColStatus = %s\n",
          utilBasisStatusToString(save_row_basis_status).c_str(),
          utilBasisStatusToString(basis.row_status[row]).c_str(),
          utilBasisStatusToString(basis.col_status[col]).c_str());
    if (basis.col_status[col] == HighsBasisStatus::kLower) {
      assert(solution.col_dual[col] > -options.dual_feasibility_tolerance);
    } else if (basis.col_status[col] == HighsBasisStatus::kUpper) {
      assert(solution.col_dual[col] < options.dual_feasibility_tolerance);
    }
  } else {
    basis.col_status[col] = HighsBasisStatus::kNonbasic;
  }
}